

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2.c
# Opt level: O2

void G_xor(uint8_t *out,uint8_t *X,uint8_t *Y)

{
  uint i;
  long lVar1;
  uint64_t R [128];
  uint64_t Z [128];
  uint64_t Q [128];
  
  for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 1) {
    R[lVar1] = *(ulong *)(Y + lVar1 * 8) ^ *(ulong *)(X + lVar1 * 8);
  }
  for (lVar1 = 0; lVar1 != 0x400; lVar1 = lVar1 + 0x80) {
    P((uint64_t *)((long)Q + lVar1),2,(uint64_t *)((long)R + lVar1),2);
  }
  for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 0x10) {
    P((uint64_t *)((long)Z + lVar1),0x10,(uint64_t *)((long)Q + lVar1),0x10);
  }
  for (lVar1 = 0; lVar1 != 0x400; lVar1 = lVar1 + 8) {
    PUT_64BIT_LSB_FIRST(out + lVar1,
                        *(ulong *)((long)R + lVar1) ^ *(ulong *)(out + lVar1) ^
                        *(ulong *)((long)Z + lVar1));
  }
  smemclr(R,0x400);
  smemclr(Q,0x400);
  smemclr(Z,0x400);
  return;
}

Assistant:

static void G_xor(uint8_t *out, const uint8_t *X, const uint8_t *Y)
{
    uint64_t R[128], Q[128], Z[128];

    for (unsigned i = 0; i < 128; i++)
        R[i] = GET_64BIT_LSB_FIRST(X + 8*i) ^ GET_64BIT_LSB_FIRST(Y + 8*i);

    for (unsigned i = 0; i < 8; i++)
        P(Q+16*i, 2, R+16*i, 2);

    for (unsigned i = 0; i < 8; i++)
        P(Z+2*i, 16, Q+2*i, 16);

    for (unsigned i = 0; i < 128; i++)
        PUT_64BIT_LSB_FIRST(out + 8*i,
                            GET_64BIT_LSB_FIRST(out + 8*i) ^ R[i] ^ Z[i]);

    smemclr(R, sizeof(R));
    smemclr(Q, sizeof(Q));
    smemclr(Z, sizeof(Z));
}